

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

int __thiscall
CVmObjFrameDesc::getp_get_targprop
          (CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_prop_id_t vVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  vm_prop_id_t *pvVar6;
  
  if (getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_targprop();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_targprop::desc);
  if (iVar5 != 0) {
    return 1;
  }
  uVar2 = *(uint *)(this->super_CVmObject).ext_;
  plVar3 = *(long **)((long)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 8);
  lVar4 = *plVar3;
  if (lVar4 == 0) {
    pvVar6 = (vm_prop_id_t *)(plVar3 + 8);
  }
  else {
    if (*(int *)(lVar4 + -0xb0) == 1) goto LAB_0025c962;
    pvVar6 = (vm_prop_id_t *)(lVar4 + -0xa8);
  }
  vVar1 = *pvVar6;
  if (vVar1 != 0) {
    retval->typ = VM_PROP;
    (retval->val).prop = vVar1;
    return 1;
  }
LAB_0025c962:
  retval->typ = VM_NIL;
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_targprop(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                       uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'targetprop' from the frame */
    get_frame_ref(vmg0_)->get_targprop(vmg_ retval);

    /* handled */
    return TRUE;
}